

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O0

int yy_find_reduce_action(int stateno,uchar iLookAhead)

{
  int iVar1;
  int i;
  uint uStack_c;
  uchar iLookAhead_local;
  int stateno_local;
  
  if (stateno < 0x83) {
    if (yy_reduce_ofst[stateno] == -0xae) {
      __assert_fail("i!=YY_REDUCE_USE_DFLT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O0/src/zcc-parse.c"
                    ,0x6a6,"int yy_find_reduce_action(int, unsigned char)");
    }
    if (iLookAhead == 0xda) {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O0/src/zcc-parse.c"
                    ,0x6a7,"int yy_find_reduce_action(int, unsigned char)");
    }
    iVar1 = (uint)iLookAhead + (int)yy_reduce_ofst[stateno];
    if (((iVar1 < 0) || (0x87f < iVar1)) || (yy_lookahead[iVar1] != iLookAhead)) {
      uStack_c = (uint)yy_default[stateno];
    }
    else {
      uStack_c = (uint)yy_action[iVar1];
    }
  }
  else {
    uStack_c = (uint)yy_default[stateno];
  }
  return uStack_c;
}

Assistant:

static int yy_find_reduce_action(
  int stateno,              /* Current state number */
  YYCODETYPE iLookAhead     /* The look-ahead token */
){
  int i;
#ifdef YYERRORSYMBOL
  if( stateno>YY_REDUCE_COUNT ){
	return yy_default[stateno];
  }
#else
  assert( stateno<=YY_REDUCE_COUNT );
#endif
  i = yy_reduce_ofst[stateno];
  assert( i!=YY_REDUCE_USE_DFLT );
  assert( iLookAhead!=YYNOCODE );
  i += iLookAhead;
#ifdef YYERRORSYMBOL
  if( i<0 || i>=YY_ACTTAB_COUNT || yy_lookahead[i]!=iLookAhead ){
    return yy_default[stateno];
  }
#else
  assert( i>=0 && i<YY_ACTTAB_COUNT );
  assert( yy_lookahead[i]==iLookAhead );
#endif
  return yy_action[i];
}